

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxValues
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *side,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minRes,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxRes,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minVal,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxVal)

{
  Real RVar1;
  bool bVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  shared_ptr<soplex::Tolerances> *psVar9;
  byte bVar10;
  fpclass_type fVar11;
  int32_t iVar12;
  undefined1 local_338 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_330;
  uint local_328 [23];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar10 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&minVal->m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&maxVal->m_backend,0);
  pnVar6 = val;
  pnVar8 = &local_b0;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
    pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (val->m_backend).exp;
  local_b0.m_backend.neg = (val->m_backend).neg;
  local_b0.m_backend.fpclass = (val->m_backend).fpclass;
  local_b0.m_backend.prec_elem = (val->m_backend).prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_130,0.0,(type *)0x0);
  psVar9 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_338,
             &psVar9->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar1 = Tolerances::epsilon((Tolerances *)local_338);
  bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130,RVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_330);
  if (bVar2) {
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)local_338,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (minRes,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_338);
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)local_338,-*pdVar4,(type *)0x0);
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_338;
      pnVar6 = minVal;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      fVar11 = (fpclass_type)local_2c0;
      iVar12 = SUB84(local_2c0,4);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&side->m_backend,&minRes->m_backend);
      local_2c0._0_4_ = cpp_dec_float_finite;
      local_2c0._4_4_ = 0x1c;
      local_338 = (undefined1  [8])0x0;
      _Stack_330._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_328[0] = 0;
      local_328[1] = 0;
      local_328[2] = 0;
      local_328[3] = 0;
      local_328[4] = 0;
      local_328[5] = 0;
      local_328[6] = 0;
      local_328[7] = 0;
      local_328[8] = 0;
      local_328[9] = 0;
      local_328[10] = 0;
      local_328[0xb] = 0;
      local_328[0xc] = 0;
      local_328[0xd] = 0;
      local_328[0xe] = 0;
      local_328[0xf] = 0;
      local_328[0x10] = 0;
      local_328[0x11] = 0;
      local_328[0x12] = 0;
      local_328[0x13] = 0;
      local_328[0x14] = 0;
      local_328[0x15] = 0;
      stack0xfffffffffffffd30 = 0;
      uStack_2cb = 0;
      iStack_2c8 = 0;
      bStack_2c4 = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_338,&result.m_backend,&val->m_backend);
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_338;
      pnVar6 = minVal;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      fVar11 = (fpclass_type)local_2c0;
      iVar12 = SUB84(local_2c0,4);
    }
    (minVal->m_backend).exp = iStack_2c8;
    (minVal->m_backend).neg = bStack_2c4;
    (minVal->m_backend).fpclass = fVar11;
    (minVal->m_backend).prec_elem = iVar12;
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)local_338,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>=
                      (maxRes,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_338);
    minRes = maxRes;
    if (tVar3) {
LAB_0042865f:
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)local_338,*pdVar4,(type *)0x0);
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_338;
      pnVar6 = maxVal;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      (maxVal->m_backend).exp = iStack_2c8;
      (maxVal->m_backend).neg = bStack_2c4;
      goto LAB_00428742;
    }
  }
  else {
    pnVar6 = val;
    pnVar8 = &local_1b0;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar10 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (val->m_backend).exp;
    local_1b0.m_backend.neg = (val->m_backend).neg;
    local_1b0.m_backend.fpclass = (val->m_backend).fpclass;
    local_1b0.m_backend.prec_elem = (val->m_backend).prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_230,0.0,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_338,
               &psVar9->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar1 = Tolerances::epsilon((Tolerances *)local_338);
    bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_1b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_230,RVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_330);
    if (!bVar2) {
      return;
    }
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)local_338,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>=
                      (maxRes,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_338);
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)local_338,-*pdVar4,(type *)0x0);
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_338;
      pnVar6 = minVal;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      fVar11 = (fpclass_type)local_2c0;
      iVar12 = SUB84(local_2c0,4);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&side->m_backend,&maxRes->m_backend);
      local_2c0._0_4_ = cpp_dec_float_finite;
      local_2c0._4_4_ = 0x1c;
      local_338 = (undefined1  [8])0x0;
      _Stack_330._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_328[0] = 0;
      local_328[1] = 0;
      local_328[2] = 0;
      local_328[3] = 0;
      local_328[4] = 0;
      local_328[5] = 0;
      local_328[6] = 0;
      local_328[7] = 0;
      local_328[8] = 0;
      local_328[9] = 0;
      local_328[10] = 0;
      local_328[0xb] = 0;
      local_328[0xc] = 0;
      local_328[0xd] = 0;
      local_328[0xe] = 0;
      local_328[0xf] = 0;
      local_328[0x10] = 0;
      local_328[0x11] = 0;
      local_328[0x12] = 0;
      local_328[0x13] = 0;
      local_328[0x14] = 0;
      local_328[0x15] = 0;
      stack0xfffffffffffffd30 = 0;
      uStack_2cb = 0;
      iStack_2c8 = 0;
      bStack_2c4 = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_338,&result.m_backend,&val->m_backend);
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_338;
      pnVar6 = minVal;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      fVar11 = (fpclass_type)local_2c0;
      iVar12 = SUB84(local_2c0,4);
    }
    (minVal->m_backend).exp = iStack_2c8;
    (minVal->m_backend).neg = bStack_2c4;
    (minVal->m_backend).fpclass = fVar11;
    (minVal->m_backend).prec_elem = iVar12;
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)local_338,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (minRes,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_338);
    if (tVar3) goto LAB_0042865f;
  }
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&side->m_backend,&minRes->m_backend);
  local_2c0._0_4_ = cpp_dec_float_finite;
  local_2c0._4_4_ = 0x1c;
  local_338 = (undefined1  [8])0x0;
  _Stack_330._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_328[0] = 0;
  local_328[1] = 0;
  local_328[2] = 0;
  local_328[3] = 0;
  local_328[4] = 0;
  local_328[5] = 0;
  local_328[6] = 0;
  local_328[7] = 0;
  local_328[8] = 0;
  local_328[9] = 0;
  local_328[10] = 0;
  local_328[0xb] = 0;
  local_328[0xc] = 0;
  local_328[0xd] = 0;
  local_328[0xe] = 0;
  local_328[0xf] = 0;
  local_328[0x10] = 0;
  local_328[0x11] = 0;
  local_328[0x12] = 0;
  local_328[0x13] = 0;
  local_328[0x14] = 0;
  local_328[0x15] = 0;
  stack0xfffffffffffffd30 = 0;
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_338,&result.m_backend,&val->m_backend);
  pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_338;
  pnVar6 = maxVal;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
    pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
  }
  (maxVal->m_backend).exp = iStack_2c8;
  (maxVal->m_backend).neg = bStack_2c4;
LAB_00428742:
  (maxVal->m_backend).fpclass = (fpclass_type)local_2c0;
  (maxVal->m_backend).prec_elem = SUB84(local_2c0,4);
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}